

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

bool verify_Board(vector<Board,_std::allocator<Board>_> *puzzles,Board *board,int posi)

{
  pointer pBVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  Board local_90;
  vector<Board,_std::allocator<Board>_> *local_58;
  Board *local_50;
  ulong local_48;
  long local_40;
  bool local_31;
  
  local_31 = posi < 1;
  if (0 < posi) {
    local_48 = (ulong)(uint)posi;
    local_40 = -local_48;
    lVar4 = 0x20;
    uVar5 = 1;
    local_58 = puzzles;
    local_50 = board;
    do {
      pBVar1 = (local_58->super__Vector_base<Board,_std::allocator<Board>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<Ship,_std::allocator<Ship>_>::vector
                (&local_90.armada,
                 (vector<Ship,_std::allocator<Ship>_> *)((long)pBVar1 + lVar4 + -0x20));
      local_90._24_8_ = *(undefined8 *)((long)pBVar1 + lVar4 + -8);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::vector(&local_90.matrix,
               (vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)((long)&(pBVar1->armada).super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl +
                  lVar4));
      bVar2 = Board::operator==(local_50,&local_90);
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~vector(&local_90.matrix);
      if (local_90.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.armada.super__Vector_base<Ship,_std::allocator<Ship>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (bVar2) break;
      local_31 = local_48 <= uVar5;
      lVar4 = lVar4 + 0x38;
      lVar3 = local_40 + uVar5;
      uVar5 = uVar5 + 1;
    } while (lVar3 != 0);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool verify_Board( std::vector< Board > &puzzles, Board board, int posi )
{
    for( int vec = 0; vec < posi; vec++ )
    {
        if( board == puzzles[vec] )
        {
            return false;
        }
    }

    return true;
}